

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O2

void aGLFramebufferDestroy(AGLFramebuffer fbo)

{
  AGLFramebuffer AVar1;
  bool bVar2;
  AGLFramebuffer fbo_local;
  
  if (fbo.name == 0) {
    fbo_local.depth_renderbuffer = fbo.depth_renderbuffer;
    AVar1 = fbo;
  }
  else {
    fbo_local = fbo;
    if (a__gl_state.framebuffer.binding == fbo.name) {
      a__gl_state.framebuffer.binding = 0;
      glBindFramebuffer(0x8d40,0);
    }
    glDeleteFramebuffers(1,&fbo_local);
    AVar1 = fbo_local;
  }
  fbo_local = AVar1;
  bVar2 = fbo_local.depth_renderbuffer != 0;
  if (bVar2) {
    glDeleteRenderbuffers(1,&fbo_local.depth_renderbuffer);
  }
  return;
}

Assistant:

void aGLFramebufferDestroy(AGLFramebuffer fbo) {
	if (fbo.name) {
		if (fbo.name == a__gl_state.framebuffer.binding)
			AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding = 0));
		glDeleteFramebuffers(1, &fbo.name);
	}

	if (fbo.depth_renderbuffer)
		glDeleteRenderbuffers(1, &fbo.depth_renderbuffer);
}